

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShapeAtomTypesSectionParser.cpp
# Opt level: O1

void __thiscall
OpenMD::ShapeAtomTypesSectionParser::parseLine
          (ShapeAtomTypesSectionParser *this,ForceField *ff,string *line,int lineNo)

{
  pointer pcVar1;
  int iVar2;
  AtomType *this_00;
  ForceField *pFVar3;
  ForceField *pFVar4;
  ForceField *this_01;
  string shapeTypeName;
  string shapeFile;
  StringTokenizer tokenizer;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  StringTokenizer local_78;
  
  pFVar3 = (ForceField *)local_b8;
  pFVar4 = (ForceField *)local_b8;
  pcVar1 = local_b8 + 0x10;
  local_b8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8," ;\t\n\r","");
  StringTokenizer::StringTokenizer(&local_78,line,(string *)local_b8);
  if ((pointer)local_b8._0_8_ != pcVar1) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
  }
  iVar2 = StringTokenizer::countTokens(&local_78);
  if (iVar2 < 2) {
    snprintf(painCave.errMsg,2000,
             "ShapesAtomTypesSectionParser Error: Not enough tokens at line %d\n",
             (ulong)(uint)lineNo);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  else {
    StringTokenizer::nextToken_abi_cxx11_((string *)local_b8,&local_78);
    StringTokenizer::nextToken_abi_cxx11_((string *)local_98,&local_78);
    this_01 = ff;
    this_00 = ForceField::getAtomType(ff,(string *)local_b8);
    if (this_00 == (AtomType *)0x0) {
      this_00 = (AtomType *)operator_new(0xf8);
      AtomType::AtomType(this_00);
      AtomType::setIdent(this_00,(int)(ff->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count + 1);
      AtomType::setName(this_00,(string *)local_b8);
      ForceField::addAtomType(ff,(string *)local_b8,this_00);
      pFVar3 = pFVar4;
      this_01 = ff;
    }
    parseShapeFile((ShapeAtomTypesSectionParser *)this_01,pFVar3,(string *)local_98,this_00);
    if ((_Base_ptr)local_98._0_8_ != (_Base_ptr)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_,(ulong)(local_98._16_8_ + 1));
    }
    if ((pointer)local_b8._0_8_ != pcVar1) {
      operator_delete((void *)local_b8._0_8_,local_b8._16_8_ + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.delim_._M_dataplus._M_p != &local_78.delim_.field_2) {
    operator_delete(local_78.delim_._M_dataplus._M_p,
                    local_78.delim_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.tokenString_._M_dataplus._M_p != &local_78.tokenString_.field_2) {
    operator_delete(local_78.tokenString_._M_dataplus._M_p,
                    local_78.tokenString_.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void ShapeAtomTypesSectionParser::parseLine(ForceField& ff,
                                              const std::string& line,
                                              int lineNo) {
    StringTokenizer tokenizer(line);

    if (tokenizer.countTokens() >= 2) {
      std::string shapeTypeName = tokenizer.nextToken();
      std::string shapeFile     = tokenizer.nextToken();

      AtomType* atomType = ff.getAtomType(shapeTypeName);
      if (atomType == NULL) {
        atomType  = new AtomType();
        int ident = ff.getNAtomType() + 1;
        atomType->setIdent(ident);
        atomType->setName(shapeTypeName);
        ff.addAtomType(shapeTypeName, atomType);
      }

      parseShapeFile(ff, shapeFile, atomType);

    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "ShapesAtomTypesSectionParser Error: "
               "Not enough tokens at line %d\n",
               lineNo);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }
  }